

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void av1_get_nz_map_contexts_sse2
               (uint8_t *levels,int16_t *scan,uint16_t eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int8_t *coeff_contexts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ushort in_DX;
  long in_RSI;
  char in_R8B;
  undefined1 *in_R9;
  int8_t *in_stack_00000010;
  int pos;
  int bhl;
  ptrdiff_t offsets [3];
  int in_stack_00000038;
  int in_stack_0000003c;
  int stride;
  int height;
  int width;
  int real_height;
  int real_width;
  int last_idx;
  ptrdiff_t *in_stack_00000098;
  int in_stack_000000a0;
  int in_stack_000000a4;
  int in_stack_000000a8;
  int in_stack_000000ac;
  uint8_t *in_stack_000000b0;
  int8_t *in_stack_00000360;
  
  iVar1 = in_DX - 1;
  if (iVar1 == 0) {
    *in_R9 = 0;
  }
  else {
    iVar2 = get_txb_wide('\0');
    iVar3 = get_txb_high('\0');
    if (in_R8B == '\0') {
      if (iVar3 == 4) {
        get_4_nz_map_contexts_2d
                  (_real_width,real_height,(ptrdiff_t *)CONCAT44(height,stride),
                   (int8_t *)CONCAT44(in_stack_0000003c,in_stack_00000038));
      }
      else if (iVar3 == 8) {
        get_8_coeff_contexts_2d
                  (_real_width,real_height,(ptrdiff_t *)CONCAT44(height,stride),
                   (int8_t *)CONCAT44(in_stack_0000003c,in_stack_00000038));
      }
      else if (iVar3 == 0x10) {
        get_16n_coeff_contexts_2d
                  (in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,in_stack_000000a4,
                   in_stack_000000a0,in_stack_00000098,in_stack_00000360);
      }
      else {
        get_16n_coeff_contexts_2d
                  (in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,in_stack_000000a4,
                   in_stack_000000a0,in_stack_00000098,in_stack_00000360);
      }
    }
    else if (in_R8B == '\x01') {
      if (iVar3 == 4) {
        get_4_nz_map_contexts_hor
                  ((uint8_t *)CONCAT44(offsets[2]._4_4_,(undefined4)offsets[2]),offsets[1]._4_4_,
                   (ptrdiff_t *)CONCAT44(offsets[0]._4_4_,(undefined4)offsets[0]),(int8_t *)_pos);
      }
      else if (iVar3 == 8) {
        get_8_coeff_contexts_hor
                  ((uint8_t *)CONCAT44(height,stride),in_stack_0000003c,
                   (ptrdiff_t *)CONCAT44(offsets[2]._4_4_,(undefined4)offsets[2]),
                   (int8_t *)CONCAT44(offsets[1]._4_4_,(undefined4)offsets[1]));
      }
      else {
        get_16n_coeff_contexts_hor
                  ((uint8_t *)CONCAT44(height,stride),in_stack_0000003c,in_stack_00000038,
                   (ptrdiff_t *)CONCAT44(offsets[2]._4_4_,(undefined4)offsets[2]),
                   (int8_t *)CONCAT44(offsets[1]._4_4_,(undefined4)offsets[1]));
      }
    }
    else if (iVar3 == 4) {
      get_4_nz_map_contexts_ver
                ((uint8_t *)CONCAT44(offsets[1]._4_4_,(undefined4)offsets[1]),offsets[0]._4_4_,_pos,
                 in_stack_00000010);
    }
    else if (iVar3 == 8) {
      get_8_coeff_contexts_ver
                ((uint8_t *)CONCAT44(in_stack_0000003c,in_stack_00000038),offsets[2]._4_4_,
                 (ptrdiff_t *)CONCAT44(offsets[1]._4_4_,(undefined4)offsets[1]),
                 (int8_t *)CONCAT44(offsets[0]._4_4_,(undefined4)offsets[0]));
    }
    else {
      get_16n_coeff_contexts_ver
                ((uint8_t *)CONCAT44(real_height,width),height,stride,
                 (ptrdiff_t *)CONCAT44(in_stack_0000003c,in_stack_00000038),
                 (int8_t *)CONCAT44(offsets[2]._4_4_,(undefined4)offsets[2]));
    }
    iVar3 = get_txb_bhl('\0');
    iVar4 = (int)*(short *)(in_RSI + (long)iVar1 * 2);
    if ((iVar2 << ((byte)iVar3 & 0x1f)) / 8 < iVar1) {
      if ((iVar2 << ((byte)iVar3 & 0x1f)) / 4 < iVar1) {
        in_R9[iVar4] = 3;
      }
      else {
        in_R9[iVar4] = 2;
      }
    }
    else {
      in_R9[iVar4] = 1;
    }
  }
  return;
}

Assistant:

void av1_get_nz_map_contexts_sse2(const uint8_t *const levels,
                                  const int16_t *const scan, const uint16_t eob,
                                  const TX_SIZE tx_size,
                                  const TX_CLASS tx_class,
                                  int8_t *const coeff_contexts) {
  const int last_idx = eob - 1;
  if (!last_idx) {
    coeff_contexts[0] = 0;
    return;
  }

  const int real_width = tx_size_wide[tx_size];
  const int real_height = tx_size_high[tx_size];
  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  const int stride = height + TX_PAD_HOR;
  ptrdiff_t offsets[3];

  /* coeff_contexts must be 16 byte aligned. */
  assert(!((intptr_t)coeff_contexts & 0xf));

  if (tx_class == TX_CLASS_2D) {
    offsets[0] = 0 * stride + 2;
    offsets[1] = 1 * stride + 1;
    offsets[2] = 2 * stride + 0;

    if (height == 4) {
      get_4_nz_map_contexts_2d(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_2d(levels, width, offsets, coeff_contexts);
    } else if (height == 16) {
      get_16n_coeff_contexts_2d(levels, real_width, real_height, width, height,
                                offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_2d(levels, real_width, real_height, width, height,
                                offsets, coeff_contexts);
    }
  } else if (tx_class == TX_CLASS_HORIZ) {
    offsets[0] = 2 * stride;
    offsets[1] = 3 * stride;
    offsets[2] = 4 * stride;
    if (height == 4) {
      get_4_nz_map_contexts_hor(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_hor(levels, width, offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_hor(levels, width, height, offsets,
                                 coeff_contexts);
    }
  } else {  // TX_CLASS_VERT
    offsets[0] = 2;
    offsets[1] = 3;
    offsets[2] = 4;
    if (height == 4) {
      get_4_nz_map_contexts_ver(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_ver(levels, width, offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_ver(levels, width, height, offsets,
                                 coeff_contexts);
    }
  }

  const int bhl = get_txb_bhl(tx_size);
  const int pos = scan[last_idx];
  if (last_idx <= (width << bhl) / 8)
    coeff_contexts[pos] = 1;
  else if (last_idx <= (width << bhl) / 4)
    coeff_contexts[pos] = 2;
  else
    coeff_contexts[pos] = 3;
}